

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O0

void debug_print_oprom_version(igsc_oprom_type type,igsc_oprom_version *oprom_version)

{
  uint uVar1;
  igsc_log_func_t p_Var2;
  char *pcVar3;
  long in_FS_OFFSET;
  igsc_log_func_t igsc_log_func;
  igsc_oprom_version *oprom_version_local;
  char local_b8 [4];
  igsc_oprom_type type_local;
  char __time_buf [128];
  
  __time_buf._120_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  uVar1 = igsc_get_log_level();
  if (uVar1 != 0) {
    p_Var2 = igsc_get_log_callback_func();
    if (p_Var2 == (igsc_log_func_t)0x0) {
      pcVar3 = gsc_time(local_b8,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n",
             pcVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
             "debug_print_oprom_version",0x99,type,(uint)oprom_version->version[0],
             (uint)oprom_version->version[1],(uint)oprom_version->version[2],
             (uint)oprom_version->version[3],(uint)oprom_version->version[4],
             (uint)oprom_version->version[5],(uint)oprom_version->version[6],
             (uint)oprom_version->version[7]);
    }
    else {
      p_Var2 = igsc_get_log_callback_func();
      pcVar3 = gsc_time(local_b8,0x80);
      (*p_Var2)(IGSC_LOG_LEVEL_DEBUG,
                "%s: IGSC: (%s:%s():%d) OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n"
                ,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
                "debug_print_oprom_version",0x99,type,(uint)oprom_version->version[0],
                (uint)oprom_version->version[1],(uint)oprom_version->version[2],
                (uint)oprom_version->version[3],(uint)oprom_version->version[4],
                (uint)oprom_version->version[5],(uint)oprom_version->version[6],
                (uint)oprom_version->version[7]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != __time_buf._120_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void debug_print_oprom_version(enum igsc_oprom_type type,
                                      const struct igsc_oprom_version *oprom_version)
{

    gsc_debug("OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n",
           type,
           oprom_version->version[0],
           oprom_version->version[1],
           oprom_version->version[2],
           oprom_version->version[3],
           oprom_version->version[4],
           oprom_version->version[5],
           oprom_version->version[6],
           oprom_version->version[7]);
}